

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_sparse.hpp
# Opt level: O0

const_pointer __thiscall
boost::numeric::ublas::
compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
::find_element(compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
               *this,size_type i)

{
  unsigned_long uVar1;
  unsigned_long *puVar2;
  const_iterator puVar3;
  size_type sVar4;
  const_reference pdVar5;
  size_type in_RSI;
  long in_RDI;
  const_subiterator_type it;
  size_type local_38;
  const_iterator local_30;
  const_iterator local_28;
  unsigned_long *local_20;
  size_type local_18;
  
  local_18 = in_RSI;
  local_28 = unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>::begin
                       ((unbounded_array<unsigned_long,_std::allocator<unsigned_long>_> *)
                        (in_RDI + 0x18));
  local_30 = unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>::begin
                       ((unbounded_array<unsigned_long,_std::allocator<unsigned_long>_> *)
                        (in_RDI + 0x18));
  local_30 = local_30 + *(long *)(in_RDI + 0x10);
  local_38 = k_based(local_18);
  puVar2 = detail::lower_bound<unsigned_long_const*,unsigned_long,std::less<unsigned_long>>
                     (&local_28,&local_30,&local_38);
  local_20 = puVar2;
  puVar3 = unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     ((unbounded_array<unsigned_long,_std::allocator<unsigned_long>_> *)
                      (in_RDI + 0x18));
  if ((puVar2 != puVar3 + *(long *)(in_RDI + 0x10)) &&
     (uVar1 = *local_20, sVar4 = k_based(local_18), puVar2 = local_20, uVar1 == sVar4)) {
    puVar3 = unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>::begin
                       ((unbounded_array<unsigned_long,_std::allocator<unsigned_long>_> *)
                        (in_RDI + 0x18));
    pdVar5 = unbounded_array<double,_std::allocator<double>_>::operator[]
                       ((unbounded_array<double,_std::allocator<double>_> *)(in_RDI + 0x30),
                        (long)puVar2 - (long)puVar3 >> 3);
    return pdVar5;
  }
  return (const_pointer)0x0;
}

Assistant:

BOOST_UBLAS_INLINE
        const_pointer find_element (size_type i) const {
            const_subiterator_type it (detail::lower_bound (index_data_.begin (), index_data_.begin () + filled_, k_based (i), std::less<size_type> ()));
            if (it == index_data_.begin () + filled_ || *it != k_based (i))
                return 0;
            return &value_data_ [it - index_data_.begin ()];
        }